

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O0

int loader_host_register
              (loader_impl host,context ctx,char *name,loader_register_invoke invoke,function *func,
              type_id return_type,size_t arg_size,type_id *args_type_id)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  type ptVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  long in_RDX;
  context in_RSI;
  loader_impl in_RDI;
  long *in_R8;
  undefined4 in_R9D;
  ulong in_stack_00000008;
  value v;
  scope sp;
  type t;
  type t_1;
  size_t iterator;
  signature s;
  function f;
  void **invoke_ptr;
  loader_impl in_stack_ffffffffffffff78;
  loader_impl impl;
  ulong local_58;
  context local_18;
  int local_4;
  
  lVar2 = function_create(in_RDX,in_stack_00000008,in_RCX,function_host_singleton);
  if (lVar2 == 0) {
    local_4 = 1;
  }
  else {
    uVar3 = function_signature(lVar2);
    if (in_stack_00000008 != 0) {
      for (local_58 = 0; local_58 < in_stack_00000008; local_58 = local_58 + 1) {
        type_id_name(*(undefined4 *)((long)v + local_58 * 4));
        ptVar4 = loader_impl_type(in_stack_ffffffffffffff78,(char *)0x10975b);
        signature_set(uVar3,local_58,"",ptVar4);
      }
    }
    impl = in_RDI;
    type_id_name(in_R9D);
    ptVar4 = loader_impl_type(impl,(char *)0x1097ab);
    signature_set_return(uVar3,ptVar4);
    if (in_RDX != 0) {
      local_18 = in_RSI;
      if (in_RSI == (context)0x0) {
        local_18 = loader_impl_context(in_RDI);
      }
      uVar3 = context_scope(local_18);
      uVar5 = value_create_function(lVar2);
      iVar1 = scope_define(uVar3,in_RDX,uVar5);
      if (iVar1 != 0) {
        value_type_destroy(uVar5);
        return 1;
      }
    }
    if (in_R8 != (long *)0x0) {
      *in_R8 = lVar2;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int loader_host_register(loader_impl host, context ctx, const char *name, loader_register_invoke invoke, function *func, type_id return_type, size_t arg_size, type_id args_type_id[])
{
	void **invoke_ptr = (void *)&invoke;

	function f = function_create(name, arg_size, *invoke_ptr, &function_host_singleton);

	if (f == NULL)
	{
		return 1;
	}

	signature s = function_signature(f);

	if (arg_size > 0)
	{
		size_t iterator;

		for (iterator = 0; iterator < arg_size; ++iterator)
		{
			static const char empty_argument_name[] = "";

			type t = loader_impl_type(host, type_id_name(args_type_id[iterator]));

			signature_set(s, iterator, empty_argument_name, t);
		}
	}

	type t = loader_impl_type(host, type_id_name(return_type));

	signature_set_return(s, t);

	if (name != NULL)
	{
		if (ctx == NULL)
		{
			ctx = loader_impl_context(host);
		}

		scope sp = context_scope(ctx);
		value v = value_create_function(f);

		if (scope_define(sp, name, v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	if (func != NULL)
	{
		*func = f;
	}

	return 0;
}